

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O1

int Gia_ManAppendMuxReal(Gia_Man_t *p,int iLitC,int iLit1,int iLit0)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  Gia_Obj_t *pGVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  
  pGVar5 = Gia_ManAppendObj(p);
  if (p->pMuxes == (uint *)0x0) {
    __assert_fail("p->pMuxes != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x2c5,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
  }
  if (iLit0 < 0) {
LAB_006e75b7:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                  ,0xf2,"int Abc_Lit2Var(int)");
  }
  uVar8 = (uint)iLit0 >> 1;
  iVar1 = p->nObjs;
  if (iVar1 <= (int)uVar8) {
    __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x2c6,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
  }
  if (iLit1 < 0) goto LAB_006e75b7;
  uVar6 = (uint)iLit1 >> 1;
  if (iVar1 <= (int)uVar6) {
    __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x2c7,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
  }
  if (iLitC < 0) goto LAB_006e75b7;
  uVar3 = (uint)iLitC >> 1;
  if (iVar1 <= (int)uVar3) {
    __assert_fail("iLitC >= 0 && Abc_Lit2Var(iLitC) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x2c8,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
  }
  if (uVar8 == uVar6) {
    __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x2c9,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
  }
  if (uVar3 == uVar8) {
    __assert_fail("Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x2ca,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
  }
  if (uVar3 == uVar6) {
    __assert_fail("Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x2cb,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
  }
  if (((iLit1 & 1U) != 0) && (p->pHTable != (int *)0x0)) {
    __assert_fail("!p->pHTable || !Abc_LitIsCompl(iLit1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x2cc,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
  }
  pGVar7 = p->pObjs;
  iVar4 = (int)pGVar5;
  if (uVar8 < uVar6) {
    if (pGVar7 + iVar1 <= pGVar5 || pGVar5 < pGVar7) goto LAB_006e7598;
    uVar2 = *(ulong *)pGVar5;
    uVar9 = (ulong)((iLit0 & 1U) << 0x1d |
                   ((uint)(iVar4 - (int)pGVar7) >> 2) * -0x55555555 - uVar8 & 0x1fffffff);
    *(ulong *)pGVar5 = uVar9 | uVar2 & 0xffffffffc0000000;
    pGVar7 = p->pObjs;
    if ((pGVar5 < pGVar7) || (pGVar7 + p->nObjs <= pGVar5)) goto LAB_006e7598;
    *(ulong *)pGVar5 =
         (ulong)(iLit1 & 1) << 0x3d |
         uVar9 | uVar2 & 0xc0000000c0000000 |
         (ulong)(((uint)(iVar4 - (int)pGVar7) >> 2) * -0x55555555 - uVar6 & 0x1fffffff) << 0x20;
    pGVar7 = p->pObjs;
    if ((pGVar5 < pGVar7) || (pGVar7 + p->nObjs <= pGVar5)) goto LAB_006e7598;
  }
  else {
    if (pGVar7 + iVar1 <= pGVar5 || pGVar5 < pGVar7) goto LAB_006e7598;
    uVar2 = *(ulong *)pGVar5;
    uVar9 = (ulong)(((uint)(iVar4 - (int)pGVar7) >> 2) * -0x55555555 - uVar8 & 0x1fffffff) << 0x20;
    uVar10 = (ulong)(iLit0 & 1) << 0x3d;
    *(ulong *)pGVar5 = uVar10 | uVar2 & 0xc0000000ffffffff | uVar9;
    pGVar7 = p->pObjs;
    if ((pGVar5 < pGVar7) || (pGVar7 + p->nObjs <= pGVar5)) goto LAB_006e7598;
    *(ulong *)pGVar5 =
         (ulong)((iLit1 & 1U) << 0x1d) | uVar10 | uVar2 & 0xc0000000c0000000 | uVar9 |
         (ulong)(((uint)(iVar4 - (int)pGVar7) >> 2) * -0x55555555 - uVar6 & 0x1fffffff);
    pGVar7 = p->pObjs;
    if ((pGVar5 < pGVar7) || (pGVar7 + p->nObjs <= pGVar5)) goto LAB_006e7598;
    iLitC = iLitC ^ 1;
  }
  p->pMuxes[(int)((ulong)((long)pGVar5 - (long)pGVar7) >> 2) * -0x55555555] = iLitC;
  p->nMuxes = p->nMuxes + 1;
  pGVar7 = p->pObjs;
  if ((pGVar7 <= pGVar5) && (pGVar5 < pGVar7 + p->nObjs)) {
    return (int)((ulong)((long)pGVar5 - (long)pGVar7) >> 2) * 0x55555556;
  }
LAB_006e7598:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline int Gia_ManAppendMuxReal( Gia_Man_t * p, int iLitC, int iLit1, int iLit0 )  
{ 
    Gia_Obj_t * pObj = Gia_ManAppendObj( p );
    assert( p->pMuxes != NULL );
    assert( iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p) );
    assert( iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p) );
    assert( iLitC >= 0 && Abc_Lit2Var(iLitC) < Gia_ManObjNum(p) );
    assert( Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1) );
    assert( Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit0) );
    assert( Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit1) );
    assert( !p->pHTable || !Abc_LitIsCompl(iLit1) );
    if ( Abc_Lit2Var(iLit0) < Abc_Lit2Var(iLit1) )
    {
        pObj->iDiff0  = Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit0);
        pObj->fCompl0 = Abc_LitIsCompl(iLit0);
        pObj->iDiff1  = Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit1);
        pObj->fCompl1 = Abc_LitIsCompl(iLit1);
        p->pMuxes[Gia_ObjId(p, pObj)] = iLitC;
    }
    else
    {
        pObj->iDiff1  = Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit0);
        pObj->fCompl1 = Abc_LitIsCompl(iLit0);
        pObj->iDiff0  = Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit1);
        pObj->fCompl0 = Abc_LitIsCompl(iLit1);
        p->pMuxes[Gia_ObjId(p, pObj)] = Abc_LitNot(iLitC);
    }
    p->nMuxes++;
    return Gia_ObjId( p, pObj ) << 1;
}